

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_>::build
          (BVHNBuilderSAHQuantized<4,_embree::QuadMv<4>_> *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer ppTVar4;
  PrimRef *pPVar5;
  MemoryMonitorInterface *pMVar6;
  Scene *pSVar7;
  GTypeMask GVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  long lVar14;
  Geometry *pGVar15;
  PrimRef *pPVar16;
  size_t sVar17;
  NodeRef root;
  uint uVar18;
  size_t i;
  ulong uVar19;
  pointer ppTVar20;
  BVH **ppBVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  BVH *pBVar25;
  double t0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  PrimInfo pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  pGVar15 = this->mesh;
  if (pGVar15 == (Geometry *)0x0) {
LAB_00c4c6a4:
    pSVar7 = this->scene;
    GVar8 = this->gtype_;
    uVar18 = (uint)GVar8;
    if ((uVar18 >> 0x14 & 1) == 0) {
      sVar17 = 0;
    }
    else {
      sVar17 = (pSVar7->world).numTriangles;
    }
    if ((uVar18 >> 0x15 & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numQuads;
    }
    if ((GVar8 & MTY_CURVE2) != ~MTY_ALL) {
      sVar17 = sVar17 + (pSVar7->world).numLineSegments;
    }
    if ((GVar8 & MTY_CURVE4) != ~MTY_ALL) {
      sVar17 = sVar17 + (pSVar7->world).numBezierCurves;
    }
    if ((GVar8 & MTY_POINTS) != ~MTY_ALL) {
      sVar17 = sVar17 + (pSVar7->world).numPoints;
    }
    if ((uVar18 >> 0x17 & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numSubdivPatches;
    }
    if ((uVar18 >> 0x1d & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numUserGeometries;
    }
    if ((uVar18 >> 0x1e & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numInstancesCheap;
    }
    if ((int)uVar18 < 0) {
      sVar17 = sVar17 + (pSVar7->world).numInstancesExpensive;
    }
    if ((uVar18 >> 0x18 & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numInstanceArrays;
    }
    if ((uVar18 >> 0x16 & 1) != 0) {
      sVar17 = sVar17 + (pSVar7->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar17;
    if (sVar17 == 0) goto LAB_00c4c82c;
    pBVar25 = this->bvh;
    std::__cxx11::to_string(&local_e8,4);
    std::operator+(&local_108,"avx::QBVH",&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_108,"BuilderSAH");
    bVar13 = true;
  }
  else {
    if (pGVar15->numPrimitives != this->numPreviousPrimitives) {
      pBVar25 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar25->alloc);
      ppTVar4 = (pBVar25->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar20 = (pBVar25->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppTVar20 != ppTVar4;
          ppTVar20 = ppTVar20 + 1) {
        FastAllocator::ThreadLocal2::unbind(*ppTVar20,&pBVar25->alloc);
      }
      ppTVar20 = (pBVar25->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar25->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar20) {
        (pBVar25->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar20;
      }
      LOCK();
      (pBVar25->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar25->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar25->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar25->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar25->alloc).usedBlocks._M_b._M_p,(pBVar25->alloc).device,
                   (pBVar25->alloc).useUSM);
      }
      LOCK();
      (pBVar25->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar25->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar25->alloc).freeBlocks._M_b._M_p,(pBVar25->alloc).device,
                   (pBVar25->alloc).useUSM);
      }
      LOCK();
      (pBVar25->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      for (lVar14 = -0x40; lVar14 != 0; lVar14 = lVar14 + 8) {
        LOCK();
        *(undefined8 *)((long)&(pBVar25->alloc).threadBlocks[0]._M_b._M_p + lVar14) = 0;
        UNLOCK();
        LOCK();
        *(undefined8 *)((long)&(pBVar25->alloc).threadBlocks[8]._M_b._M_p + lVar14) = 0;
        UNLOCK();
      }
      sVar17 = (pBVar25->alloc).primrefarray.size_alloced;
      pPVar5 = (pBVar25->alloc).primrefarray.items;
      if (pPVar5 != (PrimRef *)0x0) {
        if (sVar17 << 5 < 0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,sVar17 << 5,(pBVar25->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar17 != 0) {
        pMVar6 = (pBVar25->alloc).primrefarray.alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar17 * -0x20,1);
      }
      (pBVar25->alloc).primrefarray.items = (PrimRef *)0x0;
      (pBVar25->alloc).primrefarray.size_active = 0;
      (pBVar25->alloc).primrefarray.size_alloced = 0;
      pGVar15 = this->mesh;
      if (pGVar15 == (Geometry *)0x0) goto LAB_00c4c6a4;
    }
    sVar17 = (size_t)pGVar15->numPrimitives;
    this->numPreviousPrimitives = pGVar15->numPrimitives;
    if (sVar17 == 0) {
LAB_00c4c82c:
      sVar17 = (this->prims).size_alloced;
      pPVar5 = (this->prims).items;
      if (pPVar5 != (PrimRef *)0x0) {
        if (sVar17 << 5 < 0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,sVar17 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar17 != 0) {
        pMVar6 = (this->prims).alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar17 * -0x20,1);
      }
      (this->prims).items = (PrimRef *)0x0;
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    pBVar25 = this->bvh;
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_108);
    bVar13 = false;
  }
  ppBVar21 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar25,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (bVar13) {
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  uVar19 = (this->prims).size_alloced;
  uVar24 = uVar19;
  if ((uVar19 < sVar17) && (uVar23 = uVar19, uVar24 = sVar17, uVar19 != 0)) {
    for (; uVar24 = uVar23, uVar23 < sVar17; uVar23 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0)) {
    }
  }
  psVar1 = &(this->prims).size_active;
  if (sVar17 < (this->prims).size_active) {
    *psVar1 = sVar17;
  }
  prims = &this->prims;
  if (uVar19 == uVar24) {
    *psVar1 = sVar17;
  }
  else {
    pMVar6 = (this->prims).alloc.device;
    pPVar5 = (this->prims).items;
    uVar19 = uVar24 << 5;
    (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar19,0);
    if (uVar19 < 0x1c00000) {
      pPVar16 = (PrimRef *)alignedMalloc(uVar19,0x20);
    }
    else {
      pPVar16 = (PrimRef *)os_malloc(uVar19,&(this->prims).alloc.hugepages);
    }
    (this->prims).items = pPVar16;
    lVar14 = 0;
    for (uVar19 = 0; uVar19 < *psVar1; uVar19 = uVar19 + 1) {
      puVar2 = (undefined8 *)((long)&(pPVar5->lower).field_0 + lVar14);
      uVar10 = puVar2[1];
      uVar11 = puVar2[2];
      uVar12 = puVar2[3];
      puVar3 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar14);
      *puVar3 = *puVar2;
      puVar3[1] = uVar10;
      puVar3[2] = uVar11;
      puVar3[3] = uVar12;
      lVar14 = lVar14 + 0x20;
    }
    sVar22 = (this->prims).size_alloced;
    if (pPVar5 != (PrimRef *)0x0) {
      if (sVar22 << 5 < 0x1c00000) {
        alignedFree(pPVar5);
      }
      else {
        os_free(pPVar5,sVar22 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar22 != 0) {
      pMVar6 = (prims->alloc).device;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar22 * -0x20,1);
    }
    (this->prims).size_active = sVar17;
    (this->prims).size_alloced = uVar24;
  }
  if (this->mesh == (Geometry *)0x0) {
    avx::createPrimRefArray
              (&pinfo,this->scene,this->gtype_,false,sVar17,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    avx::createPrimRefArray
              (&pinfo,this->mesh,this->geomID_,sVar17,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar21)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar9 = (double)(sVar17 + 3 >> 2) * 1.2 * 224.0;
  uVar19 = (ulong)dVar9;
  sVar22 = ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) +
           (sVar17 * 0x50 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
  sVar17 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar17,sVar22);
  (this->settings).singleThreadThreshold = sVar17;
  local_78._8_8_ = this->bvh;
  local_78._0_8_ = &PTR_createLeaf_021e62d0;
  root = BVHNBuilderQuantizedVirtual<4>::BVHNBuilderV::build
                   ((BVHNBuilderV *)&local_78.field_1,&((BVH *)local_78._8_8_)->alloc,
                    &(((BVH *)local_78._8_8_)->scene->progressInterface).super_BuildProgressMonitor,
                    (this->prims).items,&pinfo,this->settings);
  local_78._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_78._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_68._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_68._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  local_58._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_58._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_48._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_48._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,pinfo.end - pinfo.begin);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar17 = (this->prims).size_alloced;
    pPVar5 = (this->prims).items;
    if (pPVar5 != (PrimRef *)0x0) {
      root.ptr = sVar17 << 5;
      if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar5);
      }
      else {
        os_free(pPVar5,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar17 != 0) {
      pMVar6 = (prims->alloc).device;
      root.ptr = sVar17 * -0x20;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,root.ptr,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  BVHN<4>::cleanup(*ppBVar21,(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(*ppBVar21,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          prims.clear();
          bvh->clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::QBVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif
            /* create primref array */
            prims.resize(numPrimitives);
            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* call BVH builder */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::QuantizedNode)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            NodeRef root = BVHNBuilderQuantizedVirtual<N>::build(&bvh->alloc,CreateLeafQuantized<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            //bvh->layoutLargeNodes(pinfo.size()*0.005f); // FIXME: COPY LAYOUT FOR LARGE NODES !!!
#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }